

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O3

void __thiscall
osc::OutboundPacketStream::CheckForAvailableMessageSpace
          (OutboundPacketStream *this,char *addressPattern)

{
  char *pcVar1;
  char *pcVar2;
  uint32 *puVar3;
  size_t sVar4;
  undefined8 *puVar5;
  long lVar6;
  
  pcVar1 = this->data_;
  pcVar2 = this->end_;
  lVar6 = (long)this->argumentCurrent_ - (long)pcVar1;
  if (this->messageIsInProgress_ != false) {
    lVar6 = lVar6 + ((ulong)(pcVar2 + (5 - (long)this->typeTagsCurrent_)) & 0xfffffffffffffffc);
  }
  puVar3 = this->elementSizePtr_;
  sVar4 = strlen(addressPattern);
  if ((sVar4 & 0xfffffffffffffffc) + lVar6 + (ulong)(puVar3 != (uint32 *)0x0) * 4 + 8 <=
      (ulong)((long)pcVar2 - (long)pcVar1)) {
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
  puVar5[1] = "out of buffer memory";
  *puVar5 = &PTR__exception_00178b90;
  __cxa_throw(puVar5,&OutOfBufferMemoryException::typeinfo,std::exception::~exception);
}

Assistant:

std::size_t OutboundPacketStream::Size() const
{
    std::size_t result = argumentCurrent_ - data_;
    if( IsMessageInProgress() ){
        // account for the length of the type tag string. the total type tag
        // includes an initial comma, plus at least one terminating \0
        result += RoundUp4( (end_ - typeTagsCurrent_) + 2 );
    }

    return result;
}